

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_knowledge_monsters(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  monster_race *pmVar4;
  wchar_t wVar5;
  _Bool _Var6;
  wchar_t o_count;
  int *obj_list;
  wchar_t local_a8;
  wchar_t k;
  _Bool has_base;
  wchar_t j;
  _Bool classified;
  monster_race *race;
  wchar_t local_88;
  wchar_t ind;
  wchar_t i;
  wchar_t m_count;
  int *monsters;
  member_funcs m_funcs;
  group_funcs r_funcs;
  wchar_t row_local;
  char *name_local;
  
  wVar5 = n_monster_group;
  m_funcs._48_8_ = race_name;
  memcpy(&monsters,&PTR_display_monster_00362988,0x38);
  o_count = count_known_monsters();
  default_join = (join_t *)mem_zalloc((long)o_count << 3);
  obj_list = (int *)mem_zalloc((long)o_count << 2);
  race._4_4_ = L'\0';
  local_88 = L'\0';
  do {
    pmVar4 = r_info;
    if ((int)(uint)z_info->r_max <= local_88) {
      uVar1 = CONCAT44(r_funcs.summary._4_4_,wVar5) & 0xffffff00ffffffff;
      g_funcs.gcomp = m_cmp_race;
      g_funcs.name = (_func_char_ptr_wchar_t *)m_funcs._48_8_;
      g_funcs.group = default_group_id;
      g_funcs.summary = mon_summary;
      g_funcs.maxnum = (int)uVar1;
      g_funcs.easy_know = (_Bool)(char)(uVar1 >> 0x20);
      g_funcs._37_3_ = (int3)(uVar1 >> 0x28);
      o_funcs.lore = (_func_void_wchar_t *)m_funcs.display_member;
      o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)monsters;
      o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)m_funcs.lore;
      o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)m_funcs.xchar;
      o_funcs.xtra_prompt = (_func_char_ptr_wchar_t *)m_funcs.xattr;
      o_funcs.xtra_act = (_func_void_keypress_wchar_t *)m_funcs.xtra_prompt;
      o_funcs._48_8_ = m_funcs.xtra_act;
      display_knowledge("monsters",obj_list,o_count,g_funcs,o_funcs,"                   Sym  Kills")
      ;
      mem_free(default_join);
      mem_free(obj_list);
      return;
    }
    bVar3 = false;
    if ((((l_list[local_88].all_known & 1U) != 0) || (l_list[local_88].sights != 0)) &&
       (r_info[local_88].name != (char *)0x0)) {
      for (k = L'\0'; k < n_monster_group + L'\xffffffff'; k = k + L'\x01') {
        bVar2 = false;
        if (monster_group[k].n_inc_bases != L'\0') {
          for (local_a8 = L'\0'; local_a8 < monster_group[k].n_inc_bases;
              local_a8 = local_a8 + L'\x01') {
            if (pmVar4[local_88].base == monster_group[k].inc_bases[local_a8]) {
              if (o_count <= race._4_4_) {
                __assert_fail("ind < m_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                              ,0x53f,"void do_cmd_knowledge_monsters(const char *, int)");
              }
              obj_list[race._4_4_] = race._4_4_;
              default_join[race._4_4_].oid = local_88;
              default_join[race._4_4_].gid = k;
              race._4_4_ = race._4_4_ + L'\x01';
              bVar2 = true;
              bVar3 = true;
              break;
            }
          }
        }
        if ((!bVar2) &&
           (_Var6 = flag_is_inter(pmVar4[local_88].flags,monster_group[k].inc_flags,0xb), _Var6)) {
          if (o_count <= race._4_4_) {
            __assert_fail("ind < m_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                          ,0x54c,"void do_cmd_knowledge_monsters(const char *, int)");
          }
          obj_list[race._4_4_] = race._4_4_;
          default_join[race._4_4_].oid = local_88;
          default_join[race._4_4_].gid = k;
          race._4_4_ = race._4_4_ + L'\x01';
          bVar3 = true;
        }
      }
      if (!bVar3) {
        if (o_count <= race._4_4_) {
          __assert_fail("ind < m_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                        ,0x556,"void do_cmd_knowledge_monsters(const char *, int)");
        }
        obj_list[race._4_4_] = race._4_4_;
        default_join[race._4_4_].oid = local_88;
        default_join[race._4_4_].gid = n_monster_group + L'\xffffffff';
        race._4_4_ = race._4_4_ + L'\x01';
      }
    }
    local_88 = local_88 + L'\x01';
  } while( true );
}

Assistant:

static void do_cmd_knowledge_monsters(const char *name, int row)
{
	group_funcs r_funcs = {race_name, m_cmp_race, default_group_id,
		mon_summary, n_monster_group, false };

	member_funcs m_funcs = {display_monster, mon_lore, m_xchar, m_xattr,
		recall_prompt, 0, 0};

	int *monsters;
	int m_count = count_known_monsters(), i, ind;

	default_join = mem_zalloc(m_count * sizeof(join_t));
	monsters = mem_zalloc(m_count * sizeof(int));

	ind = 0;
	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						assert(ind < m_count);
						monsters[ind] = ind;
						default_join[ind].oid = i;
						default_join[ind].gid = j;
						++ind;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				assert(ind < m_count);
				monsters[ind] = ind;
				default_join[ind].oid = i;
				default_join[ind].gid = j;
				++ind;
				classified = true;
			}
		}

		if (!classified) {
			assert(ind < m_count);
			monsters[ind] = ind;
			default_join[ind].oid = i;
			default_join[ind].gid = n_monster_group - 1;
			++ind;
		}
	}

	display_knowledge("monsters", monsters, m_count, r_funcs, m_funcs,
			"                   Sym  Kills");
	mem_free(default_join);
	mem_free(monsters);
}